

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O0

void __thiscall ccs::RuleBuilder::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  this->_vptr_Impl = (_func_int **)&PTR__Impl_00266a58;
  std::unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>::~unique_ptr(&this->ast)
  ;
  std::enable_shared_from_this<ccs::RuleBuilder::Impl>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<ccs::RuleBuilder::Impl>);
  return;
}

Assistant:

virtual ~Impl() {}